

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderDepthRangeTest::init(ShaderDepthRangeTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string *ctx_00;
  ostringstream src;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  long *local_1b8 [2];
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"attribute highp vec4 a_position;\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"varying mediump vec4 v_color;\n",0x1e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"void main (void)\n{\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\t",1);
  uVar2 = (ulong)(this->super_ShaderRenderCase).m_isVertexCase;
  pcVar3 = "gl_FragColor";
  if (uVar2 != 0) {
    pcVar3 = "v_color";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,pcVar3,(uVar2 ^ 1) * 5 + 7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n",
             0x53);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"\tgl_Position = a_position;\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,init::defaultVertSrc,&local_1b9);
  }
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,init::defaultFragSrc,&local_1ba);
  }
  else {
    std::__cxx11::stringbuf::str();
  }
  ctx_00 = (string *)local_1b8;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,ctx_00);
  if (local_1b8[0] != local_1a8) {
    ctx_00 = (string *)(local_1a8[0] + 1);
    operator_delete(local_1b8[0],(ulong)ctx_00);
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,(EVP_PKEY_CTX *)ctx_00);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  iVar1 = std::ios_base::~ios_base(local_128);
  return iVar1;
}

Assistant:

void init (void)
	{
		static const char* defaultVertSrc =
			"attribute highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n";
		static const char* defaultFragSrc =
			"varying mediump vec4 v_color;\n\n"
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = v_color;\n"
			"}\n";

		// Construct shader.
		std::ostringstream src;
		if (m_isVertexCase)
			src << "attribute highp vec4 a_position;\n"
				<< "varying mediump vec4 v_color;\n";

		src << "void main (void)\n{\n";
		src << "\t" << (m_isVertexCase ? "v_color" : "gl_FragColor") << " = vec4(gl_DepthRange.near, gl_DepthRange.far, gl_DepthRange.diff*0.5 + 0.5, 1.0);\n";

		if (m_isVertexCase)
			src << "\tgl_Position = a_position;\n";

		src << "}\n";

		m_vertShaderSource		= m_isVertexCase ? src.str()		: defaultVertSrc;
		m_fragShaderSource		= m_isVertexCase ? defaultFragSrc	: src.str();

		gls::ShaderRenderCase::init();
	}